

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O0

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deInt8 value)

{
  byte local_12;
  deInt8 local_11;
  deInt8 val;
  SeedBuilder *pSStack_10;
  deInt8 value_local;
  SeedBuilder *builder_local;
  
  local_12 = value ^ 0x4b;
  local_11 = value;
  pSStack_10 = builder;
  SeedBuilder::feed(builder,1,&local_12);
  return pSStack_10;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deInt8 value)
{
	const deInt8 val = value ^ 75;

	builder.feed(sizeof(val), &val);
	return builder;
}